

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes.c
# Opt level: O2

int mbedtls_internal_aes_encrypt(mbedtls_aes_context *ctx,uchar *input,uchar *output)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint32_t Y3;
  uint32_t Y2;
  uint32_t Y1;
  uint32_t Y0;
  uint local_54;
  uint local_50;
  int local_4c;
  uint local_48;
  uint local_44;
  uchar *local_40;
  uint *local_38;
  
  local_38 = ctx->rk;
  uVar8 = *(uint *)input ^ *local_38;
  uVar9 = *(uint *)(input + 4) ^ local_38[1];
  uVar10 = *(uint *)(input + 8) ^ local_38[2];
  uVar7 = *(uint *)(input + 0xc) ^ local_38[3];
  local_38 = local_38 + 0xc;
  iVar4 = ctx->nr >> 1;
  while (iVar5 = iVar4, 1 < iVar5) {
    uVar12 = FT0[uVar8 & 0xff] ^ local_38[-8] ^ FT1[uVar9 >> 8 & 0xff] ^
             *(uint *)((long)FT2 + (ulong)(uVar10 >> 0xe & 0x3fc)) ^ FT3[uVar7 >> 0x18];
    uVar11 = FT0[uVar9 & 0xff] ^ local_38[-7] ^ FT1[uVar10 >> 8 & 0xff] ^
             *(uint *)((long)FT2 + (ulong)(uVar7 >> 0xe & 0x3fc)) ^ FT3[uVar8 >> 0x18];
    uVar6 = FT0[uVar10 & 0xff] ^ local_38[-6] ^ FT1[uVar7 >> 8 & 0xff] ^
            *(uint *)((long)FT2 + (ulong)(uVar8 >> 0xe & 0x3fc)) ^ FT3[uVar9 >> 0x18];
    uVar7 = FT0[uVar7 & 0xff] ^ local_38[-5] ^ FT1[uVar8 >> 8 & 0xff] ^
            *(uint *)((long)FT2 + (ulong)(uVar9 >> 0xe & 0x3fc)) ^ FT3[uVar10 >> 0x18];
    uVar8 = FT0[uVar12 & 0xff] ^ local_38[-4] ^ FT1[uVar11 >> 8 & 0xff] ^
            *(uint *)((long)FT2 + (ulong)(uVar6 >> 0xe & 0x3fc)) ^ FT3[uVar7 >> 0x18];
    uVar9 = FT0[uVar11 & 0xff] ^ local_38[-3] ^ FT1[uVar6 >> 8 & 0xff] ^
            *(uint *)((long)FT2 + (ulong)(uVar7 >> 0xe & 0x3fc)) ^ FT3[uVar12 >> 0x18];
    uVar10 = FT0[uVar6 & 0xff] ^ local_38[-2] ^ FT1[uVar7 >> 8 & 0xff] ^
             *(uint *)((long)FT2 + (ulong)(uVar12 >> 0xe & 0x3fc)) ^ FT3[uVar11 >> 0x18];
    uVar7 = FT0[uVar7 & 0xff] ^ local_38[-1] ^ FT1[uVar12 >> 8 & 0xff] ^
            *(uint *)((long)FT2 + (ulong)(uVar11 >> 0xe & 0x3fc)) ^ FT3[uVar6 >> 0x18];
    local_38 = local_38 + 8;
    local_4c = iVar5;
    iVar4 = iVar5 + -1;
  }
  Y0 = FT0[uVar8 & 0xff] ^ local_38[-8] ^ FT1[uVar9 >> 8 & 0xff] ^
       *(uint *)((long)FT2 + (ulong)(uVar10 >> 0xe & 0x3fc)) ^ FT3[uVar7 >> 0x18];
  Y1 = FT0[uVar9 & 0xff] ^ local_38[-7] ^ FT1[uVar10 >> 8 & 0xff] ^
       *(uint *)((long)FT2 + (ulong)(uVar7 >> 0xe & 0x3fc)) ^ FT3[uVar8 >> 0x18];
  Y2 = FT0[uVar10 & 0xff] ^ local_38[-6] ^ FT1[uVar7 >> 8 & 0xff] ^
       *(uint *)((long)FT2 + (ulong)(uVar8 >> 0xe & 0x3fc)) ^ FT3[uVar9 >> 0x18];
  Y3 = FT0[uVar7 & 0xff] ^ local_38[-5] ^ FT1[uVar8 >> 8 & 0xff] ^
       *(uint *)((long)FT2 + (ulong)(uVar9 >> 0xe & 0x3fc)) ^ FT3[uVar10 >> 0x18];
  local_50 = ((uint)FSb[Y3 >> 0x18] << 0x18 |
             (uint)FSb[Y2 >> 0x10 & 0xff] << 0x10 | (uint)FSb[Y1 >> 8 & 0xff] << 8) ^
             (uint)FSb[Y0 & 0xff] ^ local_38[-4];
  bVar1 = FSb[Y1 & 0xff];
  uVar7 = local_38[-3];
  local_54 = ((uint)FSb[Y0 >> 0x18] << 0x18 |
             (uint)FSb[Y3 >> 0x10 & 0xff] << 0x10 | (uint)FSb[Y2 >> 8 & 0xff] << 8) ^ bVar1 ^ uVar7;
  bVar2 = FSb[Y2 & 0xff];
  uVar8 = local_38[-2];
  local_44 = ((uint)FSb[Y1 >> 0x18] << 0x18 |
             (uint)FSb[Y0 >> 0x10 & 0xff] << 0x10 | (uint)FSb[Y3 >> 8 & 0xff] << 8) ^ bVar2 ^ uVar8;
  bVar3 = FSb[Y3 & 0xff];
  uVar9 = local_38[-1];
  local_48 = ((uint)FSb[Y2 >> 0x18] << 0x18 |
             (uint)FSb[Y1 >> 0x10 & 0xff] << 0x10 | (uint)FSb[Y0 >> 8 & 0xff] << 8) ^ bVar3 ^ uVar9;
  *output = (uchar)((uint)FSb[Y0 & 0xff] ^ local_38[-4]);
  output[1] = (uchar)(local_50 >> 8);
  output[2] = (uchar)(local_50 >> 0x10);
  output[3] = (uchar)(local_50 >> 0x18);
  output[4] = (uchar)(bVar1 ^ uVar7);
  output[5] = (uchar)(local_54 >> 8);
  output[6] = (uchar)(local_54 >> 0x10);
  output[7] = (uchar)(local_54 >> 0x18);
  output[8] = (uchar)(bVar2 ^ uVar8);
  output[9] = (uchar)(local_44 >> 8);
  output[10] = (uchar)(local_44 >> 0x10);
  output[0xb] = (uchar)(local_44 >> 0x18);
  output[0xc] = (uchar)(bVar3 ^ uVar9);
  output[0xd] = (uchar)(local_48 >> 8);
  output[0xe] = (uchar)(local_48 >> 0x10);
  output[0xf] = (uchar)(local_48 >> 0x18);
  local_40 = output;
  mbedtls_platform_zeroize(&local_50,4);
  mbedtls_platform_zeroize(&local_54,4);
  mbedtls_platform_zeroize(&local_44,4);
  mbedtls_platform_zeroize(&local_48,4);
  mbedtls_platform_zeroize(&Y0,4);
  mbedtls_platform_zeroize(&Y1,4);
  mbedtls_platform_zeroize(&Y2,4);
  mbedtls_platform_zeroize(&Y3,4);
  mbedtls_platform_zeroize(&local_38,8);
  return 0;
}

Assistant:

int mbedtls_internal_aes_encrypt( mbedtls_aes_context *ctx,
                                  const unsigned char input[16],
                                  unsigned char output[16] )
{
    int i;
    uint32_t *RK, X0, X1, X2, X3, Y0, Y1, Y2, Y3;

    RK = ctx->rk;

    GET_UINT32_LE( X0, input,  0 ); X0 ^= *RK++;
    GET_UINT32_LE( X1, input,  4 ); X1 ^= *RK++;
    GET_UINT32_LE( X2, input,  8 ); X2 ^= *RK++;
    GET_UINT32_LE( X3, input, 12 ); X3 ^= *RK++;

    for( i = ( ctx->nr >> 1 ) - 1; i > 0; i-- )
    {
        AES_FROUND( Y0, Y1, Y2, Y3, X0, X1, X2, X3 );
        AES_FROUND( X0, X1, X2, X3, Y0, Y1, Y2, Y3 );
    }

    AES_FROUND( Y0, Y1, Y2, Y3, X0, X1, X2, X3 );

    X0 = *RK++ ^ \
            ( (uint32_t) FSb[ ( Y0       ) & 0xFF ]       ) ^
            ( (uint32_t) FSb[ ( Y1 >>  8 ) & 0xFF ] <<  8 ) ^
            ( (uint32_t) FSb[ ( Y2 >> 16 ) & 0xFF ] << 16 ) ^
            ( (uint32_t) FSb[ ( Y3 >> 24 ) & 0xFF ] << 24 );

    X1 = *RK++ ^ \
            ( (uint32_t) FSb[ ( Y1       ) & 0xFF ]       ) ^
            ( (uint32_t) FSb[ ( Y2 >>  8 ) & 0xFF ] <<  8 ) ^
            ( (uint32_t) FSb[ ( Y3 >> 16 ) & 0xFF ] << 16 ) ^
            ( (uint32_t) FSb[ ( Y0 >> 24 ) & 0xFF ] << 24 );

    X2 = *RK++ ^ \
            ( (uint32_t) FSb[ ( Y2       ) & 0xFF ]       ) ^
            ( (uint32_t) FSb[ ( Y3 >>  8 ) & 0xFF ] <<  8 ) ^
            ( (uint32_t) FSb[ ( Y0 >> 16 ) & 0xFF ] << 16 ) ^
            ( (uint32_t) FSb[ ( Y1 >> 24 ) & 0xFF ] << 24 );

    X3 = *RK++ ^ \
            ( (uint32_t) FSb[ ( Y3       ) & 0xFF ]       ) ^
            ( (uint32_t) FSb[ ( Y0 >>  8 ) & 0xFF ] <<  8 ) ^
            ( (uint32_t) FSb[ ( Y1 >> 16 ) & 0xFF ] << 16 ) ^
            ( (uint32_t) FSb[ ( Y2 >> 24 ) & 0xFF ] << 24 );

    PUT_UINT32_LE( X0, output,  0 );
    PUT_UINT32_LE( X1, output,  4 );
    PUT_UINT32_LE( X2, output,  8 );
    PUT_UINT32_LE( X3, output, 12 );

    mbedtls_platform_zeroize( &X0, sizeof( X0 ) );
    mbedtls_platform_zeroize( &X1, sizeof( X1 ) );
    mbedtls_platform_zeroize( &X2, sizeof( X2 ) );
    mbedtls_platform_zeroize( &X3, sizeof( X3 ) );

    mbedtls_platform_zeroize( &Y0, sizeof( Y0 ) );
    mbedtls_platform_zeroize( &Y1, sizeof( Y1 ) );
    mbedtls_platform_zeroize( &Y2, sizeof( Y2 ) );
    mbedtls_platform_zeroize( &Y3, sizeof( Y3 ) );

    mbedtls_platform_zeroize( &RK, sizeof( RK ) );

    return( 0 );
}